

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

uint GetAllocaAddress(InstructionVMEvalContext *ctx,VariableData *container)

{
  StackFrame *pSVar1;
  uint uVar2;
  StackFrame **ppSVar3;
  VariableData **ppVVar4;
  VariableData *data;
  uint i;
  uint offset;
  StackFrame *frame;
  VariableData *container_local;
  InstructionVMEvalContext *ctx_local;
  
  ppSVar3 = SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pSVar1 = *ppSVar3;
  data._4_4_ = 8;
  data._0_4_ = 0;
  while( true ) {
    uVar2 = SmallArray<VariableData_*,_4U>::size(&pSVar1->owner->allocas);
    if (uVar2 <= (uint)data) {
      return 0;
    }
    ppVVar4 = SmallArray<VariableData_*,_4U>::operator[](&pSVar1->owner->allocas,(uint)data);
    if (container == *ppVVar4) break;
    data._4_4_ = (int)(*ppVVar4)->type->size + data._4_4_;
    data._0_4_ = (uint)data + 1;
  }
  return data._4_4_;
}

Assistant:

unsigned GetAllocaAddress(InstructionVMEvalContext &ctx, VariableData *container)
{
	InstructionVMEvalContext::StackFrame *frame = ctx.stackFrames.back();

	unsigned offset = 8;

	for(unsigned i = 0; i < frame->owner->allocas.size(); i++)
	{
		VariableData *data = frame->owner->allocas[i];

		if(container == data)
			return offset;

		offset += unsigned(data->type->size);
	}

	return 0;
}